

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_writer.cpp
# Opt level: O2

void ModelWriter::write_world_model(RandomizerWorld *world)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"./json_data/item.json",&local_29);
  io::export_items_as_json(&world->super_World,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"./json_data/entity_type.json",&local_29);
  io::export_entity_types_as_json(&world->super_World,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"./json_data/map.json",&local_29);
  io::export_maps_as_json(&world->super_World,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"./json_data/map_connection.json",&local_29);
  io::export_map_connections_as_json(&world->super_World,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"./json_data/map_palette.json",&local_29);
  io::export_map_palettes_as_json(&world->super_World,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"./json_data/game_strings.json",&local_29);
  io::export_game_strings_as_json(&world->super_World,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void ModelWriter::write_world_model(const RandomizerWorld& world)
{
    io::export_items_as_json(world, "./json_data/item.json");
    io::export_entity_types_as_json(world, "./json_data/entity_type.json");
    io::export_maps_as_json(world, "./json_data/map.json");
    io::export_map_connections_as_json(world, "./json_data/map_connection.json");
    io::export_map_palettes_as_json(world, "./json_data/map_palette.json");
    io::export_game_strings_as_json(world, "./json_data/game_strings.json");
}